

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

SizeRange * __thiscall
CoreML::Specification::SequenceFeatureType::mutable_sizerange(SequenceFeatureType *this)

{
  SizeRange *this_00;
  SequenceFeatureType *this_local;
  
  if (this->sizerange_ == (SizeRange *)0x0) {
    this_00 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(this_00);
    this->sizerange_ = this_00;
  }
  return this->sizerange_;
}

Assistant:

inline ::CoreML::Specification::SizeRange* SequenceFeatureType::mutable_sizerange() {
  
  if (sizerange_ == NULL) {
    sizerange_ = new ::CoreML::Specification::SizeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SequenceFeatureType.sizeRange)
  return sizerange_;
}